

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_explore_adf.cc
# Opt level: O2

void CB_EXPLORE_ADF::get_cost_ranges
               (vector<float,_std::allocator<float>_> *min_costs,
               vector<float,_std::allocator<float>_> *max_costs,float delta,cb_explore_adf *data,
               multi_learner *base,multi_ex *examples,bool min_only)

{
  vector<v_array<ACTION_SCORE::action_score>,_std::allocator<v_array<ACTION_SCORE::action_score>_>_>
  *this;
  undefined8 *puVar1;
  float fVar2;
  float fVar3;
  example *peVar4;
  pointer pvVar5;
  pointer pvVar6;
  pointer ppeVar7;
  action_score *paVar8;
  long lVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  bool bVar13;
  action_score *paVar14;
  pointer pfVar15;
  long lVar16;
  ulong uVar17;
  multi_ex *__range1;
  size_type __new_size;
  example **ex;
  pointer ppeVar18;
  size_type sVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  anon_union_4_2_947300a4 x;
  
  bVar13 = CB::ec_is_example_header
                     (*(examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl
                       .super__Vector_impl_data._M_start);
  peVar4 = *(examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  __new_size = (long)(peVar4->pred).scalars._end - (long)(peVar4->pred).scalars._begin >> 3;
  std::vector<float,_std::allocator<float>_>::resize(min_costs,__new_size);
  std::vector<float,_std::allocator<float>_>::resize(max_costs,__new_size);
  pvVar5 = (data->ex_as).
           super__Vector_base<v_array<ACTION_SCORE::action_score>,_std::allocator<v_array<ACTION_SCORE::action_score>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((data->ex_as).
      super__Vector_base<v_array<ACTION_SCORE::action_score>,_std::allocator<v_array<ACTION_SCORE::action_score>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pvVar5) {
    (data->ex_as).
    super__Vector_base<v_array<ACTION_SCORE::action_score>,_std::allocator<v_array<ACTION_SCORE::action_score>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pvVar5;
  }
  pvVar6 = (data->ex_costs).
           super__Vector_base<v_array<CB::cb_class>,_std::allocator<v_array<CB::cb_class>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((data->ex_costs).
      super__Vector_base<v_array<CB::cb_class>,_std::allocator<v_array<CB::cb_class>_>_>._M_impl.
      super__Vector_impl_data._M_finish != pvVar6) {
    (data->ex_costs).
    super__Vector_base<v_array<CB::cb_class>,_std::allocator<v_array<CB::cb_class>_>_>._M_impl.
    super__Vector_impl_data._M_finish = pvVar6;
  }
  this = &data->ex_as;
  ppeVar7 = (examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppeVar18 = (examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                  super__Vector_impl_data._M_start; ppeVar18 != ppeVar7; ppeVar18 = ppeVar18 + 1) {
    std::
    vector<v_array<ACTION_SCORE::action_score>,_std::allocator<v_array<ACTION_SCORE::action_score>_>_>
    ::push_back(this,(value_type *)&((*ppeVar18)->pred).scalars);
    std::vector<v_array<CB::cb_class>,_std::allocator<v_array<CB::cb_class>_>_>::push_back
              (&data->ex_costs,(value_type *)&((*ppeVar18)->l).simple);
  }
  pvVar5 = (this->
           super__Vector_base<v_array<ACTION_SCORE::action_score>,_std::allocator<v_array<ACTION_SCORE::action_score>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  paVar8 = pvVar5->_end;
  for (paVar14 = pvVar5->_begin; paVar14 != paVar8; paVar14 = paVar14 + 1) {
    ((examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
     super__Vector_impl_data._M_start[paVar14->action + (uint)bVar13]->pred).scalar = paVar14->score
    ;
  }
  fVar2 = data->min_cb_cost;
  fVar3 = data->max_cb_cost;
  sVar19 = 0;
  do {
    if (__new_size == sVar19) {
      lVar16 = 0;
      for (uVar17 = 0;
          ppeVar18 = (examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                     super__Vector_impl_data._M_start,
          uVar17 < (ulong)((long)(examples->
                                 super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                                 super__Vector_impl_data._M_finish - (long)ppeVar18 >> 3);
          uVar17 = uVar17 + 1) {
        pvVar5 = (this->
                 super__Vector_base<v_array<ACTION_SCORE::action_score>,_std::allocator<v_array<ACTION_SCORE::action_score>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        lVar9 = *(long *)((long)ppeVar18 + lVar16);
        puVar1 = (undefined8 *)((long)&pvVar5->_begin + lVar16 * 4);
        uVar10 = *puVar1;
        uVar11 = puVar1[1];
        puVar1 = (undefined8 *)((long)&pvVar5->end_array + lVar16 * 4);
        uVar12 = puVar1[1];
        *(undefined8 *)(lVar9 + 0x6860) = *puVar1;
        *(undefined8 *)(lVar9 + 0x6868) = uVar12;
        *(undefined8 *)(lVar9 + 0x6850) = uVar10;
        *(undefined8 *)(lVar9 + 0x6858) = uVar11;
        pvVar6 = (data->ex_costs).
                 super__Vector_base<v_array<CB::cb_class>,_std::allocator<v_array<CB::cb_class>_>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        lVar9 = *(long *)((long)(examples->super__Vector_base<example_*,_std::allocator<example_*>_>
                                )._M_impl.super__Vector_impl_data._M_start + lVar16);
        puVar1 = (undefined8 *)((long)&pvVar6->_begin + lVar16 * 4);
        uVar10 = *puVar1;
        uVar11 = puVar1[1];
        puVar1 = (undefined8 *)((long)&pvVar6->end_array + lVar16 * 4);
        uVar12 = puVar1[1];
        *(undefined8 *)(lVar9 + 0x6838) = *puVar1;
        *(undefined8 *)(lVar9 + 0x6840) = uVar12;
        *(undefined8 *)(lVar9 + 0x6828) = uVar10;
        *(undefined8 *)(lVar9 + 0x6830) = uVar11;
        lVar16 = lVar16 + 8;
      }
      return;
    }
    peVar4 = (examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
             super__Vector_impl_data._M_start[bVar13 + sVar19];
    (peVar4->l).simple.label = fVar2 + -1.0;
    fVar20 = LEARNER::learner<char,_std::vector<example_*,_std::allocator<example_*>_>_>::
             sensitivity(base,peVar4,0);
    fVar22 = (peVar4->pred).scalar;
    if ((fVar22 < fVar2) || ((~(uint)fVar20 & 0x7f800000) == 0)) {
      pfVar15 = (min_costs->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                super__Vector_impl_data._M_start;
      fVar22 = fVar2;
LAB_001d3234:
      pfVar15[sVar19] = fVar22;
    }
    else {
      fVar21 = binary_search((fVar22 - fVar2) + 1.0,delta,fVar20,1e-06);
      fVar22 = fVar22 - fVar21 * fVar20;
      fVar20 = fVar2;
      if (fVar2 <= fVar22) {
        fVar20 = fVar22;
      }
      (min_costs->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data
      ._M_start[sVar19] = fVar20;
      pfVar15 = (min_costs->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                super__Vector_impl_data._M_start;
      fVar22 = fVar3;
      if (fVar3 < pfVar15[sVar19]) goto LAB_001d3234;
    }
    if (!min_only) {
      (peVar4->l).simple.label = fVar3 + 1.0;
      fVar20 = LEARNER::learner<char,_std::vector<example_*,_std::allocator<example_*>_>_>::
               sensitivity(base,peVar4,0);
      fVar22 = (peVar4->pred).scalar;
      if ((fVar3 < fVar22) || ((~(uint)fVar20 & 0x7f800000) == 0)) {
        pfVar15 = (max_costs->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        fVar22 = fVar3;
      }
      else {
        fVar21 = binary_search((fVar3 + 1.0) - fVar22,delta,fVar20,1e-06);
        fVar22 = fVar21 * fVar20 + fVar22;
        fVar20 = fVar3;
        if (fVar22 <= fVar3) {
          fVar20 = fVar22;
        }
        (max_costs->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
        super__Vector_impl_data._M_start[sVar19] = fVar20;
        pfVar15 = (max_costs->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        fVar22 = fVar2;
        if (fVar2 < pfVar15[sVar19] || fVar2 == pfVar15[sVar19]) goto LAB_001d3298;
      }
      pfVar15[sVar19] = fVar22;
    }
LAB_001d3298:
    sVar19 = sVar19 + 1;
  } while( true );
}

Assistant:

void get_cost_ranges(std::vector<float>& min_costs, std::vector<float>& max_costs, float delta, cb_explore_adf& data,
    multi_learner& base, multi_ex& examples, bool min_only)
{
  const bool shared = CB::ec_is_example_header(*examples[0]);
  const size_t num_actions = examples[0]->pred.a_s.size();
  min_costs.resize(num_actions);
  max_costs.resize(num_actions);

  auto& ex_as = data.ex_as;
  auto& ex_costs = data.ex_costs;
  ex_as.clear();
  ex_costs.clear();

  // backup cb example data
  for (auto& ex : examples)
  {
    ex_as.push_back(ex->pred.a_s);
    ex_costs.push_back(ex->l.cb.costs);
  }

  // set regressor predictions
  for (auto as : ex_as[0])
  {
    examples[shared + as.action]->pred.scalar = as.score;
  }

  const float cmin = data.min_cb_cost;
  const float cmax = data.max_cb_cost;

  for (size_t a = 0; a < num_actions; ++a)
  {
    example* ec = examples[shared + a];
    ec->l.simple.label = cmin - 1;
    float sens = base.sensitivity(*ec);
    float w = 0;  // importance weight

    if (ec->pred.scalar < cmin || nanpattern(sens) || infpattern(sens))
      min_costs[a] = cmin;
    else
    {
      w = binary_search(ec->pred.scalar - cmin + 1, delta, sens);
      min_costs[a] = max(ec->pred.scalar - sens * w, cmin);
      if (min_costs[a] > cmax)
        min_costs[a] = cmax;
    }

    if (!min_only)
    {
      ec->l.simple.label = cmax + 1;
      sens = base.sensitivity(*ec);
      if (ec->pred.scalar > cmax || nanpattern(sens) || infpattern(sens))
      {
        max_costs[a] = cmax;
      }
      else
      {
        w = binary_search(cmax + 1 - ec->pred.scalar, delta, sens);
        max_costs[a] = min(ec->pred.scalar + sens * w, cmax);
        if (max_costs[a] < cmin)
          max_costs[a] = cmin;
      }
    }
  }

  // reset cb example data
  for (size_t i = 0; i < examples.size(); ++i)
  {
    examples[i]->pred.a_s = ex_as[i];
    examples[i]->l.cb.costs = ex_costs[i];
  }
}